

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O1

void __thiscall lunasvg::SVGRectElement::SVGRectElement(SVGRectElement *this,Document *document)

{
  SVGGraphicsElement::SVGGraphicsElement((SVGGraphicsElement *)this,document,Rect);
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGGeometryElement_001593d0;
  (this->super_SVGGeometryElement).m_path.m_data = (plutovg_path_t *)0x0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.x = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.y = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.w = 0.0;
  (this->super_SVGGeometryElement).m_fillBoundingBox.h = 0.0;
  (this->super_SVGGeometryElement).m_strokeData.m_lineWidth = 1.0;
  (this->super_SVGGeometryElement).m_strokeData.m_miterLimit = 4.0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashOffset = 0.0;
  (this->super_SVGGeometryElement).m_strokeData.m_lineCap = Butt;
  (this->super_SVGGeometryElement).m_strokeData.m_lineJoin = Miter;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_SVGGeometryElement).m_strokeData.m_dashArray.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_SVGGeometryElement).m_fill.m_element = (SVGPaintElement *)0x0;
  (this->super_SVGGeometryElement).m_fill.m_color.m_value = 0;
  (this->super_SVGGeometryElement).m_fill.m_opacity = 0.0;
  (this->super_SVGGeometryElement).m_stroke.m_element = (SVGPaintElement *)0x0;
  (this->super_SVGGeometryElement).m_stroke.m_color.m_value = 0;
  *(undefined8 *)&(this->super_SVGGeometryElement).m_stroke.m_opacity = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_SVGGeometryElement).m_markerPositions.
           super__Vector_base<lunasvg::SVGMarkerPosition,_std::allocator<lunasvg::SVGMarkerPosition>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGRectElement_00159520;
  SVGProperty::SVGProperty(&(this->m_x).super_SVGProperty,X);
  (this->m_x).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_x).super_SVGProperty.field_0x9 = 0;
  *(undefined4 *)&(this->m_x).super_SVGProperty.field_0xc = 0;
  (this->m_x).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_y).super_SVGProperty,Y);
  (this->m_y).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_y).super_SVGProperty.field_0x9 = 1;
  *(undefined4 *)&(this->m_y).super_SVGProperty.field_0xc = 0;
  (this->m_y).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_width).super_SVGProperty,Width);
  (this->m_width).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_width).super_SVGProperty.field_0x9 = 0x100;
  *(undefined4 *)&(this->m_width).super_SVGProperty.field_0xc = 0;
  (this->m_width).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_height).super_SVGProperty,Height);
  (this->m_height).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_height).super_SVGProperty.field_0x9 = 0x101;
  *(undefined4 *)&(this->m_height).super_SVGProperty.field_0xc = 0;
  (this->m_height).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_rx).super_SVGProperty,Rx);
  (this->m_rx).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_rx).super_SVGProperty.field_0x9 = 0x100;
  *(undefined4 *)&(this->m_rx).super_SVGProperty.field_0xc = 0;
  (this->m_rx).field_0x10 = 0;
  SVGProperty::SVGProperty(&(this->m_ry).super_SVGProperty,Ry);
  (this->m_ry).super_SVGProperty._vptr_SVGProperty = (_func_int **)&PTR__SVGProperty_0015ae30;
  *(undefined2 *)&(this->m_ry).super_SVGProperty.field_0x9 = 0x101;
  *(undefined4 *)&(this->m_ry).super_SVGProperty.field_0xc = 0;
  (this->m_ry).field_0x10 = 0;
  SVGElement::addProperty((SVGElement *)this,&(this->m_x).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_width).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_height).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_rx).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_ry).super_SVGProperty);
  return;
}

Assistant:

SVGRectElement::SVGRectElement(Document* document)
    : SVGGeometryElement(document, ElementID::Rect)
    , m_x(PropertyID::X, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_y(PropertyID::Y, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_width(PropertyID::Width, LengthDirection::Horizontal, LengthNegativeMode::Forbid)
    , m_height(PropertyID::Height, LengthDirection::Vertical, LengthNegativeMode::Forbid)
    , m_rx(PropertyID::Rx, LengthDirection::Horizontal, LengthNegativeMode::Forbid)
    , m_ry(PropertyID::Ry, LengthDirection::Vertical, LengthNegativeMode::Forbid)
{
    addProperty(m_x);
    addProperty(m_y);
    addProperty(m_width);
    addProperty(m_height);
    addProperty(m_rx);
    addProperty(m_ry);
}